

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# eigen_tools.h
# Opt level: O0

iterator __thiscall
fmt::v10::formatter<Eigen::Transpose<Eigen::Matrix<double,2,1,0,2,1>>,char,void>::
format<fmt::v10::basic_format_context<fmt::v10::appender,char>>
          (formatter<Eigen::Transpose<Eigen::Matrix<double,2,1,0,2,1>>,char,void> *this,
          Transpose<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *m,
          basic_format_context<fmt::v10::appender,_char> *ctx)

{
  int _precision;
  iterator __first;
  iterator __last;
  undefined1 local_4c0 [8];
  __string_type str;
  iterator it;
  allocator<char> local_399;
  string local_398;
  allocator<char> local_371;
  string local_370;
  allocator<char> local_349;
  string local_348;
  allocator<char> local_321;
  string local_320;
  allocator<char> local_2f9;
  string local_2f8;
  allocator<char> local_2c1;
  string local_2c0;
  undefined1 local_2a0 [8];
  IOFormat format;
  stringstream ss;
  ostream local_1a0 [376];
  basic_format_context<fmt::v10::appender,_char> *local_28;
  basic_format_context<fmt::v10::appender,_char> *ctx_local;
  Transpose<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *m_local;
  formatter<Eigen::Transpose<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_char,_void> *this_local;
  
  local_28 = ctx;
  ctx_local = (basic_format_context<fmt::v10::appender,_char> *)m;
  m_local = (Transpose<Eigen::Matrix<double,_2,_1,_0,_2,_1>_> *)this;
  std::__cxx11::stringstream::stringstream((stringstream *)&format.flags);
  _precision = *(int *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2c0,", ",&local_2c1);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_2f8,"\n",&local_2f9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_320,"[",&local_321);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_348,"]",&local_349);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_370,"",&local_371);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_398,"",&local_399);
  Eigen::IOFormat::IOFormat
            ((IOFormat *)local_2a0,_precision,0,&local_2c0,&local_2f8,&local_320,&local_348,
             &local_370,&local_398,' ');
  std::__cxx11::string::~string((string *)&local_398);
  std::allocator<char>::~allocator(&local_399);
  std::__cxx11::string::~string((string *)&local_370);
  std::allocator<char>::~allocator(&local_371);
  std::__cxx11::string::~string((string *)&local_348);
  std::allocator<char>::~allocator(&local_349);
  std::__cxx11::string::~string((string *)&local_320);
  std::allocator<char>::~allocator(&local_321);
  std::__cxx11::string::~string((string *)&local_2f8);
  std::allocator<char>::~allocator(&local_2f9);
  std::__cxx11::string::~string((string *)&local_2c0);
  std::allocator<char>::~allocator(&local_2c1);
  Eigen::DenseBase<Eigen::Transpose<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>::format
            ((WithFormat<Eigen::Transpose<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_> *)&it,
             (DenseBase<Eigen::Transpose<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_> *)ctx_local,
             (IOFormat *)local_2a0);
  Eigen::operator<<(local_1a0,
                    (WithFormat<Eigen::Transpose<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_> *)&it);
  Eigen::WithFormat<Eigen::Transpose<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_>::~WithFormat
            ((WithFormat<Eigen::Transpose<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>_> *)&it);
  str.field_2._8_8_ = basic_format_context<fmt::v10::appender,_char>::out(local_28);
  std::__cxx11::stringstream::str();
  __first = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::begin
                      ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_4c0);
  __last = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::end
                     ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_4c0
                     );
  std::copy<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,fmt::v10::appender>
            ((__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__first._M_current,
             (__normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__last._M_current,(appender)str.field_2._8_8_);
  this_local = (formatter<Eigen::Transpose<Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_char,_void> *)
               str.field_2._8_8_;
  std::__cxx11::string::~string((string *)local_4c0);
  Eigen::IOFormat::~IOFormat((IOFormat *)local_2a0);
  std::__cxx11::stringstream::~stringstream((stringstream *)&format.flags);
  return (iterator)(back_insert_iterator<fmt::v10::detail::buffer<char>_>)this_local;
}

Assistant:

auto format(const MATRIX& m, FormatContext& ctx) const {
    std::stringstream ss;  // NOLINT(misc-const-correctness)
    const Eigen::IOFormat format(precision, 0, ", ", "\n", "[", "]");
    ss << m.format(format);

    auto it = ctx.out();
    auto str = ss.str();
    std::copy(str.begin(), str.end(), it);
    return it;
  }